

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_free(ggml_context *ctx)

{
  long in_RDI;
  int i;
  _Bool found;
  int local_10;
  
  ggml_critical_section_start();
  local_10 = 0;
  do {
    if (0x3f < local_10) {
LAB_00148ebe:
      ggml_critical_section_end();
      return;
    }
    if ((long)local_10 * 0x60 + 0x224a28 == in_RDI) {
      g_state.contexts[local_10].used = false;
      if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
        free(*(void **)(in_RDI + 8));
      }
      goto LAB_00148ebe;
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

void ggml_free(struct ggml_context * ctx) {
    // make this function thread safe
    ggml_critical_section_start();

    bool found = false;

    for (int i = 0; i < GGML_MAX_CONTEXTS; i++) {
        if (&g_state.contexts[i].context == ctx) {
            g_state.contexts[i].used = false;

            GGML_PRINT_DEBUG("%s: context %d with %d objects has been freed. memory used = %zu\n",
                    __func__, i, ctx->n_objects, ctx->objects_end->offs + ctx->objects_end->size);

            if (ctx->mem_buffer_owned) {
                free(ctx->mem_buffer);
            }

            found = true;
            break;
        }
    }

    if (!found) {
        GGML_PRINT_DEBUG("%s: context not found\n", __func__);
    }

    ggml_critical_section_end();
}